

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<Header>::erase(QGenericArrayOps<Header> *this,Header *b,qsizetype n)

{
  Header *pHVar1;
  long in_RDX;
  Header *in_RSI;
  long in_RDI;
  Header *end;
  Header *e;
  Header *in_stack_ffffffffffffffb8;
  Header *in_stack_ffffffffffffffc0;
  Header *local_20;
  
  local_20 = in_RSI + in_RDX;
  pHVar1 = QArrayDataPointer<Header>::begin((QArrayDataPointer<Header> *)0x1d9603);
  if ((in_RSI == pHVar1) &&
     (in_stack_ffffffffffffffc0 = local_20,
     pHVar1 = QArrayDataPointer<Header>::end((QArrayDataPointer<Header> *)local_20),
     in_stack_ffffffffffffffc0 != pHVar1)) {
    *(Header **)(in_RDI + 8) = local_20;
  }
  else {
    pHVar1 = QArrayDataPointer<Header>::end((QArrayDataPointer<Header> *)in_stack_ffffffffffffffc0);
    for (; local_20 != pHVar1; local_20 = local_20 + 1) {
      Header::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    }
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - in_RDX;
  std::destroy<Header*>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else {
            const T *const end = this->end();

            // move (by assignment) the elements from e to end
            // onto b to the new end
            while (e != end) {
                *b = std::move(*e);
                ++b;
                ++e;
            }
        }
        this->size -= n;
        std::destroy(b, e);
    }